

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Status json_array_append_string(JSON_Array *array,char *string)

{
  JSON_Status JVar1;
  JSON_Value *value_00;
  JSON_Value *value;
  JSON_Array *in_stack_ffffffffffffffd8;
  undefined4 local_4;
  
  value_00 = json_value_init_string((char *)in_stack_ffffffffffffffd8);
  if (value_00 == (JSON_Value *)0x0) {
    local_4 = -1;
  }
  else {
    JVar1 = json_array_append_value(in_stack_ffffffffffffffd8,(JSON_Value *)0x28634e);
    if (JVar1 == 0) {
      local_4 = 0;
    }
    else {
      json_value_free(value_00);
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

JSON_Status json_array_append_string(JSON_Array *array, const char *string) {
    JSON_Value *value = json_value_init_string(string);
    if (value == NULL) {
        return JSONFailure;
    }
    if (json_array_append_value(array, value) != JSONSuccess) {
        json_value_free(value);
        return JSONFailure;
    }
    return JSONSuccess;
}